

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.cpp
# Opt level: O2

void __thiscall
ObserverManager_TwoProtocolsSubscribe_Test::TestBody
          (ObserverManager_TwoProtocolsSubscribe_Test *this)

{
  B *this_00;
  char *message;
  AssertHelper local_1d0;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  stringstream out;
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&out);
  this_00 = (B *)operator_new(0x28);
  B::B(this_00,local_188);
  ObserverManager::subscribe<TicTacProtocol,B>(this_00);
  ObserverManager::subscribe<FooBarProtocol,B>(this_00);
  ObserverManager::notify<TicTacProtocol>((ObserverManager *)0x11,0);
  ObserverManager::notify<FooBarProtocol,std::__cxx11::string_const&,char_const*>
            ((ObserverManager *)0x19,0,"Toe");
  (*(this_00->super_FooBarProtocol).super_BaseObserverProtocol._vptr_BaseObserverProtocol[1])
            (this_00);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[13],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"Tic Tac Toe \"","out.str()",(char (*) [13])"Tic Tac Toe ",
             &local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1b8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/fnz[P]ObserverManager/Tests/Basic.cpp"
               ,0x36,message);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  return;
}

Assistant:

TEST(ObserverManager, TwoProtocolsSubscribe) {
    std::stringstream out;

    B* b = new B(out);
    ObserverManager::subscribe<TicTacProtocol>(b);
    ObserverManager::subscribe<FooBarProtocol>(b);
    
    ObserverManager::notify(&TicTacProtocol::ticTac);
    ObserverManager::notify(&FooBarProtocol::bar, "Toe");
    
    delete b;

    EXPECT_EQ("Tic Tac Toe ", out.str());
}